

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O1

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  long lVar15;
  bool bVar16;
  Mat local_a8;
  Option *local_58;
  int local_4c;
  int local_48;
  int local_44;
  Mat *local_40;
  Mat *local_38;
  
  uVar1 = bottom_blob->dims;
  local_48 = bottom_blob->w;
  local_4c = bottom_blob->h;
  local_44 = bottom_blob->c;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar14 = this->squeeze_w != 0 && local_48 == 1;
    bVar10 = this->squeeze_h != 0 && local_4c == 1;
    bVar11 = this->squeeze_c != 0 && local_44 == 1;
  }
  else {
    lVar15 = (long)(this->axes).w;
    if (lVar15 < 1) {
      bVar14 = false;
      bVar10 = false;
      bVar11 = false;
      local_40 = bottom_blob;
    }
    else {
      bVar16 = local_48 == 1;
      lVar12 = 0;
      bVar10 = false;
      bVar14 = false;
      bVar4 = false;
      do {
        iVar13 = *(int *)((long)pvVar2 + lVar12 * 4);
        iVar13 = (iVar13 >> 0x1f & uVar1) + iVar13;
        bVar5 = bVar10;
        bVar6 = bVar14;
        bVar11 = bVar4;
        if (iVar13 == 0) {
          bVar5 = local_4c == 1;
          bVar6 = bVar16;
          bVar11 = local_44 == 1;
        }
        if (uVar1 != 2) {
          bVar5 = bVar10;
        }
        if (uVar1 != 1) {
          bVar6 = bVar14;
        }
        bVar10 = bVar5;
        bVar7 = bVar6;
        if (iVar13 == 1) {
          bVar10 = local_4c == 1;
          bVar7 = bVar16;
        }
        if (uVar1 != 2) {
          bVar7 = bVar6;
        }
        bVar14 = bVar7;
        if (iVar13 == 2) {
          bVar14 = bVar16;
        }
        if (uVar1 != 3) {
          bVar11 = bVar4;
          bVar10 = bVar5;
          bVar14 = bVar7;
        }
        lVar12 = lVar12 + 1;
        local_40 = bottom_blob;
        local_38 = top_blob;
        bVar4 = bVar11;
      } while (lVar15 != lVar12);
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_40 = bottom_blob;
            free(top_blob->data);
            bottom_blob = local_40;
          }
        }
        else {
          local_40 = bottom_blob;
          (*top_blob->allocator->_vptr_Allocator[3])();
          bottom_blob = local_40;
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar13 = bottom_blob->w;
    iVar8 = bottom_blob->h;
    iVar9 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar13;
    top_blob->h = iVar8;
    top_blob->d = iVar9;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (uVar1 != 3) {
    local_58 = opt;
    if (uVar1 != 2) {
      if ((uVar1 == 1) && (bVar14)) {
        Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              if (local_a8.data != (void *)0x0) {
                free(local_a8.data);
              }
            }
            else {
              (*(local_a8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_0029fab2;
    }
    if (bVar14) {
      if (bVar10) {
        Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_0029fab2;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_0029fab2;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,local_4c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_0029fab2;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_0029fab2;
        }
      }
    }
    else {
      if (!bVar10) goto LAB_0029fab2;
      Mat::reshape(&local_a8,bottom_blob,local_48,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_0029fab2;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_0029fab2;
      }
    }
    if (local_a8.data != (void *)0x0) {
      free(local_a8.data);
    }
    goto LAB_0029fab2;
  }
  if ((bool)(bVar14 & bVar10)) {
    if (bVar11) {
      Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_0029fab2;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_0029fab2;
      }
    }
    else {
      if (!bVar10) goto LAB_0029f4af;
      Mat::reshape(&local_a8,bottom_blob,local_44,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_0029fab2;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_0029fab2;
      }
    }
  }
  else if ((bool)(bVar10 & bVar11)) {
    Mat::reshape(&local_a8,bottom_blob,local_48,opt->blob_allocator);
    if (&local_a8 != top_blob) {
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_a8.data;
      top_blob->refcount = local_a8.refcount;
      top_blob->elemsize = local_a8.elemsize;
      top_blob->elempack = local_a8.elempack;
      top_blob->allocator = local_a8.allocator;
      top_blob->dims = local_a8.dims;
      top_blob->w = local_a8.w;
      top_blob->h = local_a8.h;
      top_blob->d = local_a8.d;
      top_blob->c = local_a8.c;
      top_blob->cstep = local_a8.cstep;
    }
    if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
    LOCK();
    *local_a8.refcount = *local_a8.refcount + -1;
    UNLOCK();
    if (*local_a8.refcount != 0) goto LAB_0029fab2;
    if (local_a8.allocator != (Allocator *)0x0) {
      (*(local_a8.allocator)->_vptr_Allocator[3])();
      goto LAB_0029fab2;
    }
  }
  else {
LAB_0029f4af:
    if (bVar14) {
      if (bVar11) {
        Mat::reshape(&local_a8,bottom_blob,local_4c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_0029fab2;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_0029fab2;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,local_4c,local_44,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_0029fab2;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_0029fab2;
        }
      }
    }
    else if (bVar10) {
      Mat::reshape(&local_a8,bottom_blob,local_48,local_44,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_0029fab2;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_0029fab2;
      }
    }
    else {
      if (!bVar11) goto LAB_0029fab2;
      Mat::reshape(&local_a8,bottom_blob,local_48,local_4c,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_0029fab2;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_0029fab2;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_0029fab2;
      }
    }
  }
  if (local_a8.data != (void *)0x0) {
    free(local_a8.data);
  }
LAB_0029fab2:
  if (top_blob->data == (void *)0x0) {
    iVar13 = -100;
  }
  else {
    iVar13 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}